

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConstantPadLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  unsigned_long uVar3;
  bool bVar4;
  unsigned_long *puVar5;
  long *plVar6;
  undefined8 *puVar7;
  uint uVar8;
  uint uVar9;
  ulong *puVar10;
  size_type *psVar11;
  ulong uVar12;
  Result *_result;
  uint uVar13;
  undefined1 *puVar14;
  int index;
  uint uVar15;
  uint uVar16;
  string err;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  ulong local_58;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,2);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ConstantPad","");
  validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (layer->_oneof_case_[0] == 0x483) {
    puVar14 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar14 = Specification::_ConstantPaddingLayerParams_default_instance_;
  }
  if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ != 1) {
LAB_00353c08:
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  uVar16 = (((ConvolutionLayerParams *)puVar14)->kernelsize_).current_size_;
  if ((uVar16 & 1) == 0) {
    if (uVar16 != 0) {
      if ((((ConstantPaddingLayerParams *)puVar14)->padtogivenoutputsizemode_ == true) &&
         (0 < (int)uVar16 >> 1)) {
        index = 0;
        uVar13 = 0;
        local_58 = (ulong)(uint)((int)uVar16 >> 1);
        do {
          puVar5 = google::protobuf::RepeatedField<unsigned_long>::Get
                             (&((ConvolutionLayerParams *)puVar14)->kernelsize_,index);
          uVar3 = *puVar5;
          puVar5 = google::protobuf::RepeatedField<unsigned_long>::Get
                             (&((ConvolutionLayerParams *)puVar14)->kernelsize_,index + 1);
          if ((0 < (int)uVar3) && (0 < (int)*puVar5)) {
            std::operator+(&local_78,"In \'ConstantPad\' layer \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
            puVar10 = (ulong *)(plVar6 + 2);
            if ((ulong *)*plVar6 == puVar10) {
              local_a8 = *puVar10;
              lStack_a0 = plVar6[3];
              local_b8 = &local_a8;
            }
            else {
              local_a8 = *puVar10;
              local_b8 = (ulong *)*plVar6;
            }
            local_b0 = plVar6[1];
            *plVar6 = (long)puVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            uVar16 = 1;
            if (uVar13 < 10) goto LAB_00354028;
            uVar12 = (ulong)uVar13;
            uVar15 = 4;
            goto LAB_00353fec;
          }
          uVar13 = uVar13 + 1;
          index = index + 2;
        } while ((uint)local_58 != uVar13);
      }
      goto LAB_00353c08;
    }
    std::operator+(&local_f8,"In \'ConstantPad\' layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_d8.field_2._M_allocated_capacity = *psVar11;
      local_d8.field_2._8_8_ = plVar6[3];
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar11;
      local_d8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_d8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d8);
  }
  else {
    std::operator+(&local_78,"In \'ConstantPad\' layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
    puVar10 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar10) {
      local_a8 = *puVar10;
      lStack_a0 = plVar6[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *puVar10;
      local_b8 = (ulong *)*plVar6;
    }
    local_b0 = plVar6[1];
    *plVar6 = (long)puVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    uVar13 = -uVar16;
    if (0 < (int)uVar16) {
      uVar13 = uVar16;
    }
    uVar15 = 1;
    if (9 < uVar13) {
      uVar12 = (ulong)uVar13;
      uVar9 = 4;
      do {
        uVar15 = uVar9;
        uVar8 = (uint)uVar12;
        if (uVar8 < 100) {
          uVar15 = uVar15 - 2;
          goto LAB_00353d91;
        }
        if (uVar8 < 1000) {
          uVar15 = uVar15 - 1;
          goto LAB_00353d91;
        }
        if (uVar8 < 10000) goto LAB_00353d91;
        uVar12 = uVar12 / 10000;
        uVar9 = uVar15 + 4;
      } while (99999 < uVar8);
      uVar15 = uVar15 + 1;
    }
LAB_00353d91:
    local_98 = local_88;
    std::__cxx11::string::_M_construct((ulong)&local_98,(char)uVar15 - (char)((int)uVar16 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_98 + (ulong)(uVar16 >> 0x1f)),uVar15,uVar13);
    uVar12 = 0xf;
    if (local_b8 != &local_a8) {
      uVar12 = local_a8;
    }
    if (uVar12 < (ulong)(local_90 + local_b0)) {
      uVar12 = 0xf;
      if (local_98 != local_88) {
        uVar12 = local_88[0];
      }
      if (uVar12 < (ulong)(local_90 + local_b0)) goto LAB_00353e03;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_b8);
    }
    else {
LAB_00353e03:
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_98);
    }
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    psVar11 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_f8.field_2._M_allocated_capacity = *psVar11;
      local_f8.field_2._8_8_ = puVar7[3];
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar11;
      local_f8._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_f8._M_string_length = puVar7[1];
    *puVar7 = psVar11;
    puVar7[1] = 0;
    *(undefined1 *)psVar11 = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    psVar11 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_d8.field_2._M_allocated_capacity = *psVar11;
      local_d8.field_2._8_8_ = puVar7[3];
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar11;
      local_d8._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_d8._M_string_length = puVar7[1];
    *puVar7 = psVar11;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
    return __return_storage_ptr__;
  }
  goto LAB_00353f3e;
  while( true ) {
    if (uVar9 < 10000) goto LAB_00354028;
    uVar12 = uVar12 / 10000;
    uVar15 = uVar16 + 4;
    if (uVar9 < 100000) break;
LAB_00353fec:
    uVar16 = uVar15;
    uVar9 = (uint)uVar12;
    if (uVar9 < 100) {
      uVar16 = uVar16 - 2;
      goto LAB_00354028;
    }
    if (uVar9 < 1000) {
      uVar16 = uVar16 - 1;
      goto LAB_00354028;
    }
  }
  uVar16 = uVar16 + 1;
LAB_00354028:
  local_98 = local_88;
  std::__cxx11::string::_M_construct((ulong)&local_98,(char)uVar16);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_98,uVar16,uVar13);
  uVar12 = 0xf;
  if (local_b8 != &local_a8) {
    uVar12 = local_a8;
  }
  if (uVar12 < (ulong)(local_90 + local_b0)) {
    uVar12 = 0xf;
    if (local_98 != local_88) {
      uVar12 = local_88[0];
    }
    if (uVar12 < (ulong)(local_90 + local_b0)) goto LAB_00354093;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_b8);
  }
  else {
LAB_00354093:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_98);
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  psVar11 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_f8.field_2._M_allocated_capacity = *psVar11;
    local_f8.field_2._8_8_ = puVar7[3];
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar11;
    local_f8._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_f8._M_string_length = puVar7[1];
  *puVar7 = psVar11;
  puVar7[1] = 0;
  *(undefined1 *)psVar11 = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
  psVar11 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_d8.field_2._M_allocated_capacity = *psVar11;
    local_d8.field_2._8_8_ = puVar7[3];
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar11;
    local_d8._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_d8._M_string_length = puVar7[1];
  *puVar7 = psVar11;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
    return __return_storage_ptr__;
  }
LAB_00353f3e:
  operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConstantPadLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "ConstantPad", blobNameToRank));

    const auto& params = layer.constantpad();

    if (layer.input_size() == 1) {
        int len = params.padamounts_size();
        if (len % 2 != 0) {
            const std::string err = "In 'ConstantPad' layer '" + layer.name() + "', length of 'padAmounts' parameter is " + std::to_string(len) + ", an odd value, which is not allowed.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (len == 0) {
            const std::string err = "In 'ConstantPad' layer '" + layer.name() + "', length of 'padAmounts' cannot be zero when only 1 input is provided.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (params.padtogivenoutputsizemode()) {
            for (int i=0; i < len/2; i++) {
                int pad_a = (int)params.padamounts(2*i);
                int pad_b = (int)params.padamounts(2*i+1);
                if (pad_a > 0 && pad_b > 0) {
                    const std::string err = "In 'ConstantPad' layer '" + layer.name() + "', 'padToGivenOutputSizeMode' is true, and both padding values corresponding to dimension " + std::to_string(i) + " are non zero, which is invalid. Only one value can be non-zero.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    return Result();
}